

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPSources::BYETimeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime *pRVar1;
  byte bVar2;
  RTPInternalSourceData *pRVar3;
  HashElement *pHVar4;
  HashElement *pHVar5;
  RTPMemoryManager *pRVar6;
  _func_int **pp_Var7;
  HashElement *pHVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  
  dVar12 = curtime->m_t - timeoutdelay->m_t;
  pHVar8 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar8;
  if (pHVar8 == (HashElement *)0x0) {
    iVar11 = 0;
    iVar10 = 0;
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    iVar10 = 0;
    iVar11 = 0;
    do {
      pRVar3 = pHVar8->element;
      if ((pRVar3->super_RTPSourceData).receivedbye == true) {
        if ((pRVar3 == this->owndata) ||
           (pRVar1 = &(pRVar3->super_RTPSourceData).byetime,
           dVar12 < pRVar1->m_t || dVar12 == pRVar1->m_t)) {
          bVar2 = (pRVar3->super_RTPSourceData).issender;
          goto LAB_00129792;
        }
        this->totalcount = this->totalcount + -1;
        if ((pRVar3->super_RTPSourceData).issender == true) {
          this->sendercount = this->sendercount + -1;
        }
        if (((pRVar3->super_RTPSourceData).validated == true) &&
           (((pRVar3->super_RTPSourceData).receivedbye & 1U) == 0)) {
          this->activecount = this->activecount + -1;
        }
        pHVar4 = pHVar8->hashprev;
        pHVar5 = pHVar8->hashnext;
        if (pHVar4 == (HashElement *)0x0) {
          (this->sourcelist).table[pHVar8->hashindex] = pHVar5;
        }
        else {
          pHVar4->hashnext = pHVar5;
        }
        if (pHVar5 != (HashElement *)0x0) {
          pHVar5->hashprev = pHVar4;
        }
        pHVar8 = (this->sourcelist).curhashelem;
        pHVar4 = pHVar8->listprev;
        pHVar5 = pHVar8->listnext;
        if (pHVar4 == (HashElement *)0x0) {
          (this->sourcelist).firsthashelem = pHVar5;
          if (pHVar5 == (HashElement *)0x0) {
            (this->sourcelist).lasthashelem = (HashElement *)0x0;
          }
          else {
            pHVar5->listprev = (HashElement *)0x0;
          }
        }
        else {
          pHVar4->listnext = pHVar5;
          if (pHVar5 == (HashElement *)0x0) {
            (this->sourcelist).lasthashelem = pHVar4;
          }
          else {
            pHVar5->listprev = pHVar4;
          }
        }
        pRVar6 = (this->sourcelist).super_RTPMemoryObject.mgr;
        if (pRVar6 == (RTPMemoryManager *)0x0) {
          operator_delete(pHVar8,0x30);
        }
        else {
          (**(code **)(*(long *)pRVar6 + 0x18))(pRVar6,pHVar8);
        }
        (this->sourcelist).curhashelem = pHVar5;
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])(this,pRVar3);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,pRVar3);
        pRVar6 = (this->super_RTPMemoryObject).mgr;
        pp_Var7 = (pRVar3->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject;
        if (pRVar6 == (RTPMemoryManager *)0x0) {
          (*pp_Var7[1])(pRVar3);
        }
        else {
          (**pp_Var7)(pRVar3);
          (**(code **)(*(long *)pRVar6 + 0x18))(pRVar6,pRVar3);
        }
        pHVar8 = (this->sourcelist).curhashelem;
      }
      else {
        bVar2 = (pRVar3->super_RTPSourceData).issender;
        iVar10 = iVar10 + (uint)(pRVar3->super_RTPSourceData).validated;
LAB_00129792:
        iVar11 = iVar11 + (uint)bVar2;
        iVar9 = iVar9 + 1;
        pHVar8 = pHVar8->listnext;
        (this->sourcelist).curhashelem = pHVar8;
      }
    } while (pHVar8 != (HashElement *)0x0);
  }
  this->totalcount = iVar9;
  this->sendercount = iVar11;
  this->activecount = iVar10;
  return;
}

Assistant:

void RTPSources::BYETimeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		
		if (srcdat->ReceivedBYE())
		{
			RTPTime byetime = srcdat->GetBYETime();

			if ((srcdat != owndata) && (checktime > byetime))
			{
				totalcount--;
				if (srcdat->IsSender())
					sendercount--;
				if (srcdat->IsActive())
					activecount--;
				sourcelist.DeleteCurrentElement();
				OnBYETimeout(srcdat);
				OnRemoveSource(srcdat);
				RTPDelete(srcdat,GetMemoryManager());
			}
			else
			{
				newtotalcount++;
				if (srcdat->IsSender())
					newsendercount++;
				if (srcdat->IsActive())
					newactivecount++;
				sourcelist.GotoNextElement();
			}
		}
		else
		{
			newtotalcount++;
			if (srcdat->IsSender())
				newsendercount++;
			if (srcdat->IsActive())
				newactivecount++;
			sourcelist.GotoNextElement();
		}
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}